

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_rand.c
# Opt level: O0

int EVP_RAND_instantiate
              (EVP_RAND_CTX *ctx,uint strength,int prediction_resistance,uchar *pstr,size_t pstr_len
              ,OSSL_PARAM *params)

{
  int iVar1;
  EVP_RAND_CTX *in_RCX;
  undefined8 in_R8;
  uchar *in_R9;
  int res;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  iVar1 = evp_rand_lock((EVP_RAND_CTX *)
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = evp_rand_instantiate_locked
                        (in_RCX,(uint)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (OSSL_PARAM *)0x430dba);
    evp_rand_unlock((EVP_RAND_CTX *)0x430dc8);
  }
  return local_4;
}

Assistant:

int EVP_RAND_instantiate(EVP_RAND_CTX *ctx, unsigned int strength,
                         int prediction_resistance,
                         const unsigned char *pstr, size_t pstr_len,
                         const OSSL_PARAM params[])
{
    int res;

    if (!evp_rand_lock(ctx))
        return 0;
    res = evp_rand_instantiate_locked(ctx, strength, prediction_resistance,
                                      pstr, pstr_len, params);
    evp_rand_unlock(ctx);
    return res;
}